

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_addrnotavail_2(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t server;
  long lStack_990;
  undefined4 uStack_988;
  undefined8 uStack_984;
  undefined4 uStack_97c;
  undefined1 auStack_978 [216];
  code *pcStack_8a0;
  long lStack_890;
  long lStack_888;
  long alStack_880 [11];
  undefined1 auStack_828 [16];
  long alStack_818 [25];
  undefined1 auStack_750 [16];
  long alStack_740 [27];
  code *pcStack_668;
  long lStack_658;
  long lStack_650;
  undefined1 auStack_648 [216];
  code *pcStack_570;
  long lStack_560;
  long lStack_558;
  undefined1 auStack_550 [16];
  long alStack_540 [27];
  code *pcStack_468;
  long lStack_458;
  long lStack_450;
  undefined1 auStack_448 [16];
  long alStack_438 [27];
  code *pcStack_360;
  long lStack_350;
  long lStack_348;
  undefined8 auStack_340 [2];
  undefined1 auStack_330 [16];
  long alStack_320 [27];
  code *pcStack_248;
  long lStack_240;
  long lStack_238;
  char acStack_230 [72];
  undefined1 auStack_1e8 [216];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [16];
  long local_e0 [27];
  
  pcStack_110 = (code *)0x1c6881;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,local_f0);
  local_e0[0] = (long)iVar1;
  local_100 = 0;
  if (local_e0[0] == 0) {
    pcStack_110 = (code *)0x1c68a6;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c68b3;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_100 = (long)iVar1;
    local_f8 = 0;
    if (local_100 != 0) goto LAB_001c69b4;
    pcStack_110 = (code *)0x1c68e4;
    iVar1 = uv_tcp_bind(local_e0,local_f0,0);
    local_100 = (long)iVar1;
    local_f8 = -99;
    if (local_100 != -99) goto LAB_001c69c3;
    pcStack_110 = (code *)0x1c6915;
    uv_close(local_e0,close_cb);
    pcStack_110 = (code *)0x1c691a;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c6924;
    uv_run(uVar2,0);
    local_100 = 1;
    local_f8 = (long)close_cb_called;
    if (local_f8 != 1) goto LAB_001c69d2;
    pcStack_110 = (code *)0x1c694e;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x1c6962;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1c696c;
    uv_run(unaff_RBX,0);
    local_100 = 0;
    pcStack_110 = (code *)0x1c697a;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c6982;
    iVar1 = uv_loop_close(uVar2);
    local_f8 = (long)iVar1;
    if (local_100 == local_f8) {
      pcStack_110 = (code *)0x1c699a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1c69b4;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_001c69b4:
    pcStack_110 = (code *)0x1c69c3;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_001c69c3:
    pcStack_110 = (code *)0x1c69d2;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_001c69d2:
    pcStack_110 = (code *)0x1c69e1;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  pcStack_110 = run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_230 + 0x30,"h blah blah",0xc);
  builtin_strncpy(acStack_230 + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_230 + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(acStack_230,"blah blah blah b",0x10);
  pcStack_248 = (code *)0x1c6a2d;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_248 = (code *)0x1c6a3a;
  iVar1 = uv_tcp_init(uVar2,auStack_1e8);
  lStack_238 = (long)iVar1;
  lStack_240 = 0;
  if (lStack_238 == 0) {
    pcStack_248 = (code *)0x1c6a69;
    iVar1 = uv_tcp_bind(auStack_1e8,acStack_230,0);
    lStack_238 = (long)iVar1;
    lStack_240 = -0x16;
    if (lStack_238 != -0x16) goto LAB_001c6b2d;
    pcStack_248 = (code *)0x1c6a98;
    uv_close(auStack_1e8,close_cb);
    pcStack_248 = (code *)0x1c6a9d;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x1c6aa7;
    uv_run(uVar2,0);
    lStack_238 = 1;
    lStack_240 = (long)close_cb_called;
    if (lStack_240 != 1) goto LAB_001c6b3a;
    pcStack_248 = (code *)0x1c6acb;
    unaff_RBX = uv_default_loop();
    pcStack_248 = (code *)0x1c6adf;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_248 = (code *)0x1c6ae9;
    uv_run(unaff_RBX,0);
    lStack_238 = 0;
    pcStack_248 = (code *)0x1c6af7;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x1c6aff;
    iVar1 = uv_loop_close(uVar2);
    lStack_240 = (long)iVar1;
    if (lStack_238 == lStack_240) {
      pcStack_248 = (code *)0x1c6b15;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_248 = (code *)0x1c6b2d;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c6b2d:
    pcStack_248 = (code *)0x1c6b3a;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c6b3a:
    pcStack_248 = (code *)0x1c6b47;
    run_test_tcp_bind_error_fault_cold_3();
  }
  pcStack_248 = run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  pcStack_360 = (code *)0x1c6b72;
  pcStack_248 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_330);
  alStack_320[0] = (long)iVar1;
  auStack_340[0] = 0;
  if (alStack_320[0] == 0) {
    pcStack_360 = (code *)0x1c6ba8;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,auStack_340);
    alStack_320[0] = (long)iVar1;
    lStack_350 = 0;
    if (alStack_320[0] != 0) goto LAB_001c6d0c;
    pcStack_360 = (code *)0x1c6bcd;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c6bda;
    iVar1 = uv_tcp_init(uVar2,alStack_320);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c6d1b;
    pcStack_360 = (code *)0x1c6c0b;
    iVar1 = uv_tcp_bind(alStack_320,auStack_330,0);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c6d2a;
    pcStack_360 = (code *)0x1c6c3c;
    iVar1 = uv_tcp_bind(alStack_320,auStack_340,0);
    lStack_350 = (long)iVar1;
    lStack_348 = -0x16;
    if (lStack_350 != -0x16) goto LAB_001c6d39;
    pcStack_360 = (code *)0x1c6c6d;
    uv_close(alStack_320,close_cb);
    pcStack_360 = (code *)0x1c6c72;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c6c7c;
    uv_run(uVar2,0);
    lStack_350 = 1;
    lStack_348 = (long)close_cb_called;
    if (lStack_348 != 1) goto LAB_001c6d48;
    pcStack_360 = (code *)0x1c6ca6;
    unaff_RBX = uv_default_loop();
    pcStack_360 = (code *)0x1c6cba;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_360 = (code *)0x1c6cc4;
    uv_run(unaff_RBX,0);
    lStack_350 = 0;
    pcStack_360 = (code *)0x1c6cd2;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c6cda;
    iVar1 = uv_loop_close(uVar2);
    lStack_348 = (long)iVar1;
    if (lStack_350 == lStack_348) {
      pcStack_360 = (code *)0x1c6cf2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_360 = (code *)0x1c6d0c;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c6d0c:
    pcStack_360 = (code *)0x1c6d1b;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c6d1b:
    pcStack_360 = (code *)0x1c6d2a;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c6d2a:
    pcStack_360 = (code *)0x1c6d39;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c6d39:
    pcStack_360 = (code *)0x1c6d48;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c6d48:
    pcStack_360 = (code *)0x1c6d57;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_360 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_468 = (code *)0x1c6d84;
  pcStack_360 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_448);
  alStack_438[0] = (long)iVar1;
  lStack_458 = 0;
  if (alStack_438[0] == 0) {
    pcStack_468 = (code *)0x1c6da9;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c6db6;
    iVar1 = uv_tcp_init(uVar2,alStack_438);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c6e6e;
    pcStack_468 = (code *)0x1c6de7;
    iVar1 = uv_tcp_bind(alStack_438,auStack_448,0);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c6e7d;
    pcStack_468 = (code *)0x1c6e08;
    unaff_RBX = uv_default_loop();
    pcStack_468 = (code *)0x1c6e1c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_468 = (code *)0x1c6e26;
    uv_run(unaff_RBX,0);
    lStack_458 = 0;
    pcStack_468 = (code *)0x1c6e34;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c6e3c;
    iVar1 = uv_loop_close(uVar2);
    lStack_450 = (long)iVar1;
    if (lStack_458 == lStack_450) {
      pcStack_468 = (code *)0x1c6e54;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_468 = (code *)0x1c6e6e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c6e6e:
    pcStack_468 = (code *)0x1c6e7d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c6e7d:
    pcStack_468 = (code *)0x1c6e8c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_468 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_570 = (code *)0x1c6eb9;
  pcStack_468 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_550);
  alStack_540[0] = (long)iVar1;
  lStack_560 = 0;
  if (alStack_540[0] == 0) {
    pcStack_570 = (code *)0x1c6ede;
    uVar2 = uv_default_loop();
    pcStack_570 = (code *)0x1c6eeb;
    iVar1 = uv_tcp_init(uVar2,alStack_540);
    lStack_560 = (long)iVar1;
    lStack_558 = 0;
    if (lStack_560 != 0) goto LAB_001c6fa6;
    pcStack_570 = (code *)0x1c6f1f;
    iVar1 = uv_tcp_bind(alStack_540,auStack_550,1);
    lStack_560 = (long)iVar1;
    lStack_558 = -0x16;
    if (lStack_560 != -0x16) goto LAB_001c6fb5;
    pcStack_570 = (code *)0x1c6f40;
    unaff_RBX = uv_default_loop();
    pcStack_570 = (code *)0x1c6f54;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_570 = (code *)0x1c6f5e;
    uv_run(unaff_RBX,0);
    lStack_560 = 0;
    pcStack_570 = (code *)0x1c6f6c;
    uVar2 = uv_default_loop();
    pcStack_570 = (code *)0x1c6f74;
    iVar1 = uv_loop_close(uVar2);
    lStack_558 = (long)iVar1;
    if (lStack_560 == lStack_558) {
      pcStack_570 = (code *)0x1c6f8c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_570 = (code *)0x1c6fa6;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c6fa6:
    pcStack_570 = (code *)0x1c6fb5;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c6fb5:
    pcStack_570 = (code *)0x1c6fc4;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_570 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_668 = (code *)0x1c6fe0;
  pcStack_570 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_668 = (code *)0x1c6fed;
  iVar1 = uv_tcp_init(uVar2,auStack_648);
  lStack_650 = (long)iVar1;
  lStack_658 = 0;
  if (lStack_650 == 0) {
    pcStack_668 = (code *)0x1c701e;
    iVar1 = uv_listen(auStack_648,0x80,0);
    lStack_650 = (long)iVar1;
    lStack_658 = 0;
    if (lStack_650 != 0) goto LAB_001c70a5;
    pcStack_668 = (code *)0x1c703f;
    unaff_RBX = uv_default_loop();
    pcStack_668 = (code *)0x1c7053;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_668 = (code *)0x1c705d;
    uv_run(unaff_RBX,0);
    lStack_650 = 0;
    pcStack_668 = (code *)0x1c706b;
    uVar2 = uv_default_loop();
    pcStack_668 = (code *)0x1c7073;
    iVar1 = uv_loop_close(uVar2);
    lStack_658 = (long)iVar1;
    if (lStack_650 == lStack_658) {
      pcStack_668 = (code *)0x1c708b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_668 = (code *)0x1c70a5;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c70a5:
    pcStack_668 = (code *)0x1c70b4;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_668 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcStack_8a0 = (code *)0x1c70e1;
  pcStack_668 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_828);
  alStack_740[0] = (long)iVar1;
  alStack_818[0] = 0;
  if (alStack_740[0] == 0) {
    pcStack_8a0 = (code *)0x1c7112;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c7122;
    iVar1 = uv_tcp_init(uVar2,alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c73aa;
    pcStack_8a0 = (code *)0x1c715c;
    iVar1 = uv_tcp_bind(alStack_740,auStack_828,0);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c73bc;
    pcStack_8a0 = (code *)0x1c7196;
    iVar1 = uv_listen(alStack_740,0x80,0);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c73ce;
    pcStack_8a0 = (code *)0x1c71c9;
    iVar1 = uv_is_writable(alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c73e0;
    pcStack_8a0 = (code *)0x1c71fc;
    iVar1 = uv_is_readable(alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c73f2;
    pcStack_8a0 = (code *)0x1c7233;
    auStack_750 = uv_buf_init("PING",4);
    pcStack_8a0 = (code *)0x1c7262;
    iVar1 = uv_write(alStack_818,alStack_740,auStack_750,1,0);
    alStack_880[0] = (long)iVar1;
    lStack_890 = -0x20;
    if (alStack_880[0] != -0x20) goto LAB_001c7404;
    pcStack_8a0 = (code *)0x1c7296;
    iVar1 = uv_shutdown(alStack_880,alStack_740,0);
    lStack_890 = (long)iVar1;
    lStack_888 = -0x6b;
    if (lStack_890 != -0x6b) goto LAB_001c7413;
    pcStack_8a0 = (code *)0x1c72cd;
    iVar1 = uv_read_start(alStack_740,abort);
    lStack_890 = (long)iVar1;
    lStack_888 = -0x6b;
    if (lStack_890 != -0x6b) goto LAB_001c7422;
    pcStack_8a0 = (code *)0x1c7301;
    uv_close(alStack_740,close_cb);
    pcStack_8a0 = (code *)0x1c7306;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c7310;
    uv_run(uVar2,0);
    lStack_890 = 1;
    lStack_888 = (long)close_cb_called;
    if (lStack_888 != 1) goto LAB_001c7431;
    pcStack_8a0 = (code *)0x1c733a;
    unaff_RBX = uv_default_loop();
    pcStack_8a0 = (code *)0x1c734e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_8a0 = (code *)0x1c7358;
    uv_run(unaff_RBX,0);
    lStack_890 = 0;
    pcStack_8a0 = (code *)0x1c7366;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c736e;
    iVar1 = uv_loop_close(uVar2);
    lStack_888 = (long)iVar1;
    if (lStack_890 == lStack_888) {
      pcStack_8a0 = (code *)0x1c738a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8a0 = (code *)0x1c73aa;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c73aa:
    pcStack_8a0 = (code *)0x1c73bc;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c73bc:
    pcStack_8a0 = (code *)0x1c73ce;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c73ce:
    pcStack_8a0 = (code *)0x1c73e0;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c73e0:
    pcStack_8a0 = (code *)0x1c73f2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c73f2:
    pcStack_8a0 = (code *)0x1c7404;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c7404:
    pcStack_8a0 = (code *)0x1c7413;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c7413:
    pcStack_8a0 = (code *)0x1c7422;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c7422:
    pcStack_8a0 = (code *)0x1c7431;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c7431:
    pcStack_8a0 = (code *)0x1c7440;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  pcStack_8a0 = run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_984 = 0;
  uStack_97c = 0;
  uStack_988 = 0xf270002;
  pcStack_8a0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_978);
  lStack_990 = (long)iVar1;
  if (lStack_990 == 0) {
    uv_close(auStack_978,0);
    iVar1 = uv_tcp_bind(auStack_978,&uStack_988,0);
    lStack_990 = (long)iVar1;
    if (lStack_990 != -0x16) goto LAB_001c75a5;
    iVar1 = uv_listen(auStack_978,5,0);
    lStack_990 = (long)iVar1;
    if (lStack_990 != -0x16) goto LAB_001c75b4;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    lStack_990 = (long)iVar1;
    if (lStack_990 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_990 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_990 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c75d2;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c75a5:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c75b4:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c75d2:
  plVar3 = &lStack_990;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_2) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("4.4.4.4", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}